

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

bool __thiscall
pbrt::DisplayItem::ImageChannelBuffer::SendIfChanged
          (ImageChannelBuffer *this,IPCChannel *ipcChannel,int tileIndex)

{
  int iVar1;
  bool bVar2;
  uint64_t uVar3;
  bool bVar4;
  span<const_unsigned_char> message;
  
  iVar1 = this->setCount;
  if (0x4000 < (long)iVar1) {
    memset((this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + (long)iVar1 * 4 + (long)this->channelValuesOffset,0,
           (ulong)(iVar1 - 0x4000) << 2);
  }
  uVar3 = MurmurHash64A((this->buffer).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + this->channelValuesOffset,0x10000,0);
  bVar4 = true;
  if (uVar3 != (this->tileHashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[tileIndex]) {
    message.n = (long)this->channelValuesOffset + (long)this->setCount * 4;
    message.ptr = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    bVar2 = IPCChannel::Send(ipcChannel,message);
    if (bVar2) {
      (this->tileHashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[tileIndex] = uVar3;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool DisplayItem::ImageChannelBuffer::SendIfChanged(IPCChannel &ipcChannel,
                                                    int tileIndex) {
    int excess = setCount - tileSize * tileSize;
    if (excess > 0)
        memset(buffer.data() + channelValuesOffset + setCount * sizeof(float), 0,
               excess * sizeof(float));

    uint64_t hash = HashBuffer(buffer.data() + channelValuesOffset,
                               tileSize * tileSize * sizeof(float));
    if (hash == tileHashes[tileIndex])
        return true;

    if (!ipcChannel.Send(pstd::MakeSpan(buffer.data(),
                                        channelValuesOffset + setCount * sizeof(float))))
        return false;

    tileHashes[tileIndex] = hash;
    return true;
}